

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsValidation.cpp
# Opt level: O2

bool __thiscall
chrono::utils::ChValidation::Process
          (ChValidation *this,string *sim_filename,string *ref_filename,char delim)

{
  Data *data;
  _Expr<std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_ValArray,_double,_double>,_double>
  *__e;
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  ChValidation *pCVar4;
  ostream *poVar5;
  size_t col;
  ulong uVar6;
  double dVar7;
  undefined1 local_60 [24];
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  local_40 = (pointer)&this->m_sim_data;
  sVar1 = ReadDataFile(sim_filename,delim,&this->m_sim_headers,(Data *)local_40);
  this->m_num_rows = sVar1;
  data = &this->m_ref_data;
  this->m_num_cols =
       (long)(this->m_sim_headers).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->m_sim_headers).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  sVar1 = ReadDataFile(ref_filename,delim,&this->m_ref_headers,data);
  std::valarray<double>::resize(&this->m_L2_norms,0,0.0);
  std::valarray<double>::resize(&this->m_RMS_norms,0,0.0);
  local_38 = (pointer)&this->m_INF_norms;
  std::valarray<double>::resize((valarray<double> *)local_38,0,0.0);
  if (this->m_num_cols ==
      (long)(this->m_ref_headers).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->m_ref_headers).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    if (this->m_num_rows == sVar1) {
      local_48 = (pointer)(data->
                          super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
      local_60._16_8_ =
           (((_Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_> *)
            &local_40->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
      pCVar4 = (ChValidation *)local_60;
      std::valarray<double>::
      valarray<std::__detail::_BinClos<std::__minus,std::_ValArray,std::_ValArray,double,double>>
                ((valarray<double> *)local_60,
                 (_Expr<std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_ValArray,_double,_double>,_double>
                  *)(local_60 + 0x10));
      dVar7 = L2norm(pCVar4,(DataVector *)local_60);
      ::operator_delete((void *)local_60._8_8_);
      if (dVar7 <= 1e-10) {
        std::valarray<double>::resize(&this->m_L2_norms,this->m_num_cols - 1,0.0);
        std::valarray<double>::resize(&this->m_RMS_norms,this->m_num_cols - 1,0.0);
        std::valarray<double>::resize((valarray<double> *)local_38,this->m_num_cols - 1,0.0);
        lVar2 = 0x10;
        __e = (_Expr<std::__detail::_BinClos<std::__minus,_std::_ValArray,_std::_ValArray,_double,_double>,_double>
               *)(local_60 + 0x10);
        for (uVar6 = 0; uVar6 < this->m_num_cols - 1; uVar6 = uVar6 + 1) {
          local_48 = (pointer)((long)&((data->
                                       super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar2)
          ;
          local_60._16_8_ =
               (long)&((((_Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                          *)&local_40->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start)->
                      _M_size + lVar2;
          pCVar4 = (ChValidation *)local_60;
          std::valarray<double>::
          valarray<std::__detail::_BinClos<std::__minus,std::_ValArray,std::_ValArray,double,double>>
                    ((valarray<double> *)local_60,__e);
          dVar7 = L2norm(pCVar4,(DataVector *)local_60);
          (this->m_L2_norms)._M_data[uVar6] = dVar7;
          ::operator_delete((void *)local_60._8_8_);
          local_60._16_8_ =
               (long)&((this->m_sim_data).
                       super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar2;
          local_48 = (pointer)((long)&((this->m_ref_data).
                                       super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar2);
          pCVar4 = (ChValidation *)local_60;
          std::valarray<double>::
          valarray<std::__detail::_BinClos<std::__minus,std::_ValArray,std::_ValArray,double,double>>
                    ((valarray<double> *)local_60,__e);
          dVar7 = RMSnorm(pCVar4,(DataVector *)local_60);
          (this->m_RMS_norms)._M_data[uVar6] = dVar7;
          ::operator_delete((void *)local_60._8_8_);
          local_60._16_8_ =
               (long)&((this->m_sim_data).
                       super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar2;
          local_48 = (pointer)((long)&((this->m_ref_data).
                                       super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_size + lVar2);
          pCVar4 = (ChValidation *)local_60;
          std::valarray<double>::
          valarray<std::__detail::_BinClos<std::__minus,std::_ValArray,std::_ValArray,double,double>>
                    ((valarray<double> *)local_60,__e);
          dVar7 = INFnorm(pCVar4,(DataVector *)local_60);
          (this->m_INF_norms)._M_data[uVar6] = dVar7;
          ::operator_delete((void *)local_60._8_8_);
          lVar2 = lVar2 + 0x10;
        }
        return true;
      }
      poVar5 = (ostream *)&std::cout;
      pcVar3 = "ERROR: time sequences do not match.";
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "ERROR: the number of rows in the two files is different:");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"   File ");
      poVar5 = std::operator<<(poVar5,(string *)sim_filename);
      poVar5 = std::operator<<(poVar5," has ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5," columns");
      std::endl<char,std::char_traits<char>>(poVar5);
      poVar5 = std::operator<<((ostream *)&std::cout,"   File ");
      poVar5 = std::operator<<(poVar5,(string *)ref_filename);
      poVar5 = std::operator<<(poVar5," has ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      pcVar3 = " columns";
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "ERROR: the number of columns in the two files is different:");
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,"   File ");
    poVar5 = std::operator<<(poVar5,(string *)sim_filename);
    poVar5 = std::operator<<(poVar5," has ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," columns");
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,"   File ");
    poVar5 = std::operator<<(poVar5,(string *)ref_filename);
    poVar5 = std::operator<<(poVar5," has ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    pcVar3 = " columns";
  }
  poVar5 = std::operator<<(poVar5,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar5);
  return false;
}

Assistant:

bool ChValidation::Process(const std::string& sim_filename,
                           const std::string& ref_filename,
                           char               delim)
{
  // Read the simulation results file.
  m_num_rows = ReadDataFile(sim_filename, delim, m_sim_headers, m_sim_data);
  m_num_cols = m_sim_headers.size();

  // Read the reference data file.
  size_t num_ref_rows = ReadDataFile(ref_filename, delim, m_ref_headers, m_ref_data);

  // Resize the arrays of norms to zero length
  // (needed if we return with an error below)
  m_L2_norms.resize(0);
  m_RMS_norms.resize(0);
  m_INF_norms.resize(0);

  // Perform some sanity checks.
  if (m_num_cols != m_ref_headers.size()) {
    std::cout << "ERROR: the number of columns in the two files is different:" << std::endl;
    std::cout << "   File " << sim_filename << " has " << m_num_cols << " columns" << std::endl;
    std::cout << "   File " << ref_filename << " has " << m_ref_headers.size() << " columns" << std::endl;
    return false;
  }

  if (m_num_rows != num_ref_rows) {
    std::cout << "ERROR: the number of rows in the two files is different:" << std::endl;
    std::cout << "   File " << sim_filename << " has " << m_num_rows << " columns" << std::endl;
    std::cout << "   File " << ref_filename << " has " << num_ref_rows << " columns" << std::endl;
    return false;
  }

  // Ensure that the first columns (time) are the same.
  if (L2norm(m_sim_data[0] - m_ref_data[0]) > 1e-10) {
    std::cout << "ERROR: time sequences do not match." << std::endl;
    return false;
  }

  // Resize arrays of norms.
  m_L2_norms.resize(m_num_cols - 1);
  m_RMS_norms.resize(m_num_cols - 1);
  m_INF_norms.resize(m_num_cols - 1);

  // Calculate norms of the differences.
  for (size_t col = 0; col < m_num_cols - 1; col++) {
    m_L2_norms[col] = L2norm(m_sim_data[col + 1] - m_ref_data[col + 1]);
    m_RMS_norms[col] = RMSnorm(m_sim_data[col + 1] - m_ref_data[col + 1]);
    m_INF_norms[col] = INFnorm(m_sim_data[col + 1] - m_ref_data[col + 1]);
  }

  return true;
}